

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.cpp
# Opt level: O0

int GetHeadDataSeanetEx(SEANET *pSeanet,uchar *scanline,double *pAngle)

{
  int iVar1;
  char *pcVar2;
  int local_40cc;
  int local_4094;
  char **ppcStack_4090;
  int byte;
  char *str;
  char data [8193];
  char local_207c [4];
  undefined8 uStack_2078;
  char SOf [4];
  double Seconds;
  undefined4 local_2068;
  int Bearing;
  int Node;
  int Min;
  int Hour;
  int i;
  char line [8193];
  double *pAngle_local;
  uchar *scanline_local;
  SEANET *pSeanet_local;
  
  unique0x100004f4 = pAngle;
  if (bSeanetFromFile == 0) {
    pSeanet_local._4_4_ = GetHeadDataSeanet(pSeanet,scanline,pAngle);
  }
  else {
    Min = 0;
    Node = 0;
    Bearing = 0;
    local_2068 = 0;
    Seconds._4_4_ = 0;
    uStack_2078 = 0;
    ppcStack_4090 = (char **)0x0;
    local_4094 = 0;
    mSleep((long)pSeanet->threadperiod);
    EnterCriticalSection(&StateVariablesCS);
    if (seanetfilenextlinecmd < 1) {
      if (seanetfilenextlinecmd == 0) {
        LeaveCriticalSection(&StateVariablesCS);
        return 0;
      }
    }
    else {
      seanetfilenextlinecmd = seanetfilenextlinecmd + -1;
    }
    LeaveCriticalSection(&StateVariablesCS);
    pcVar2 = fgets3(seanetfile,(char *)&Hour,0x2001);
    if (pcVar2 == (char *)0x0) {
      printf("Error reading Seanet CSV file.\n");
      pSeanet_local._4_4_ = 1;
    }
    else {
      memset(local_207c,0,4);
      data[0x1ff8] = '\0';
      Hdctrl.u = 0;
      iVar1 = __isoc99_sscanf(&Hour,"%03s,%d:%d:%lf,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%8192s",
                              local_207c,&Node,&Bearing,&stack0xffffffffffffdf88,&local_2068,
                              &pSeanet->HeadStatus,&pSeanet->HeadHdCtrl,&pSeanet->HeadRangescale,
                              &pSeanet->HeadIGain,&pSeanet->HeadSlope,&pSeanet->HeadADLow,
                              &pSeanet->HeadADSpan,&pSeanet->HeadLeftLim,&pSeanet->HeadRightLim,
                              &pSeanet->HeadSteps,(long)&Seconds + 4,&pSeanet->Dbytes,&str);
      if (iVar1 == 0x12) {
        iVar1 = strcmp(local_207c,"DIG");
        if (iVar1 == 0) {
          pSeanet->bDST = 1;
        }
        else {
          pSeanet->bDST = 0;
        }
        pSeanet->adc8on = (pSeanet->HeadHdCtrl).u & 1;
        if (((pSeanet->HeadHdCtrl).u & 1) == 0) {
          local_40cc = pSeanet->Dbytes << 1;
        }
        else {
          local_40cc = pSeanet->Dbytes;
        }
        pSeanet->HeadNBins = local_40cc;
        pSeanet->NSteps = (int)(360.0 / ((double)pSeanet->HeadSteps * 0.05625));
        pSeanet->StepAngleSize = (double)pSeanet->HeadSteps * 0.05625;
        pSeanet->RangeScale = pSeanet->HeadRangescale / 10;
        EnterCriticalSection(&SeanetConnectingCS);
        if ((((AdLow != pSeanet->HeadADLow) || (AdSpan != pSeanet->HeadADSpan)) ||
            (Steps != pSeanet->HeadSteps)) ||
           ((((Hdctrl.u != (pSeanet->HeadHdCtrl).u || (NBins != pSeanet->HeadNBins)) ||
             ((NSteps != pSeanet->NSteps ||
              ((StepAngleSize != pSeanet->StepAngleSize ||
               (NAN(StepAngleSize) || NAN(pSeanet->StepAngleSize))))))) ||
            (rangescale != pSeanet->RangeScale)))) {
          AdLow = pSeanet->HeadADLow;
          AdSpan = pSeanet->HeadADSpan;
          Steps = pSeanet->HeadSteps;
          Hdctrl = pSeanet->HeadHdCtrl;
          NBins = pSeanet->HeadNBins;
          NSteps = pSeanet->NSteps;
          StepAngleSize = pSeanet->StepAngleSize;
          rangescale = pSeanet->RangeScale;
          index_scanlines_prev = 0;
          index_scanlines = 0;
          free(tvs);
          free(angles);
          free(scanlines);
          tvs = (timeval *)0x0;
          angles = (double *)0x0;
          scanlines = (uchar *)0x0;
          tvs = (timeval *)calloc((long)NSteps,0x10);
          angles = (double *)calloc((long)NSteps,8);
          scanlines = (uchar *)calloc((long)(NSteps << 0xb),1);
          if (((tvs == (timeval *)0x0) || (angles == (double *)0x0)) || (scanlines == (uchar *)0x0))
          {
            printf("Unable to allocate Seanet data.\n");
            LeaveCriticalSection(&SeanetConnectingCS);
            return 1;
          }
        }
        LeaveCriticalSection(&SeanetConnectingCS);
        *stack0xffffffffffffffb0 = (double)((Seconds._4_4_ + 0xc80) % 0x1900) * 0.05625;
        ppcStack_4090 = &str;
        if ((Hdctrl.u & 1) == 0) {
          for (Min = 0; Min < pSeanet->Dbytes; Min = Min + 1) {
            __isoc99_sscanf(ppcStack_4090,"%d",&local_4094);
            scanline[Min << 1] = (uchar)((local_4094 >> 4) << 4);
            scanline[Min * 2 + 1] = (uchar)(((local_4094 << 4) >> 4) << 4);
            pcVar2 = strchr((char *)ppcStack_4090,0x2c);
            if (pcVar2 == (char *)0x0) break;
            ppcStack_4090 = (char **)(pcVar2 + 1);
          }
        }
        else {
          for (Min = 0; Min < pSeanet->Dbytes; Min = Min + 1) {
            __isoc99_sscanf(ppcStack_4090,"%d",&local_4094);
            scanline[Min] = (uchar)local_4094;
            pcVar2 = strchr((char *)ppcStack_4090,0x2c);
            if (pcVar2 == (char *)0x0) break;
            ppcStack_4090 = (char **)(pcVar2 + 1);
          }
        }
        pSeanet_local._4_4_ = 0;
      }
      else {
        printf("Skipping an invalid line in the CSV file.\n");
        pSeanet_local._4_4_ = 0;
      }
    }
  }
  return pSeanet_local._4_4_;
}

Assistant:

int GetHeadDataSeanetEx(SEANET* pSeanet, unsigned char* scanline, double* pAngle)
{
	if (!bSeanetFromFile) return GetHeadDataSeanet(pSeanet, scanline, pAngle);
	else
	{
		char line[4*MAX_NB_BYTES_SEANET+1];
		int i = 0;

		int Hour = 0, Min = 0, Node = 0, Bearing = 0;
		double Seconds = 0;
		char SOf[3+1];
		char data[4*MAX_NB_BYTES_SEANET+1];
		char* str = NULL;
		int byte = 0;

		mSleep(pSeanet->threadperiod);

		EnterCriticalSection(&StateVariablesCS);
		if (seanetfilenextlinecmd > 0) seanetfilenextlinecmd--;
		else if (seanetfilenextlinecmd == 0) { LeaveCriticalSection(&StateVariablesCS); return EXIT_SUCCESS; }
		LeaveCriticalSection(&StateVariablesCS);

		// Get a sonar scanline from the file.
		if (fgets3(seanetfile, line, sizeof(line)) == NULL)
		{
			printf("Error reading Seanet CSV file.\n");
			return EXIT_FAILURE;
		}

		memset(SOf, 0, sizeof(SOf));
		//memset(data, 0, sizeof(data));
		data[sizeof(data)-1] = 0; // The last character must be a 0 to be a valid string for sscanf.
		Hdctrl.i = 0;

		if (sscanf(line, "%03s,%d:%d:%lf,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%8192s",
			SOf, &Hour, &Min, &Seconds, &Node, &pSeanet->HeadStatus, &pSeanet->HeadHdCtrl.i, &pSeanet->HeadRangescale, &pSeanet->HeadIGain, &pSeanet->HeadSlope,
			&pSeanet->HeadADLow, &pSeanet->HeadADSpan, &pSeanet->HeadLeftLim, &pSeanet->HeadRightLim, &pSeanet->HeadSteps, &Bearing, &pSeanet->Dbytes, data) != 18)
		{
			printf("Skipping an invalid line in the CSV file.\n");
			return EXIT_SUCCESS;
		}

		if (strcmp(SOf, "DIG") == 0) pSeanet->bDST = TRUE; else pSeanet->bDST = FALSE;
		pSeanet->adc8on = (BOOL)pSeanet->HeadHdCtrl.bits.adc8on;
		pSeanet->HeadNBins = pSeanet->HeadHdCtrl.bits.adc8on?pSeanet->Dbytes:2*pSeanet->Dbytes;
		pSeanet->NSteps = RESOLUTION2NUMBER_OF_STEPS(pSeanet->HeadSteps);
		pSeanet->StepAngleSize = RESOLUTION2STEP_ANGLE_SIZE_IN_DEGREES(pSeanet->HeadSteps);
		pSeanet->RangeScale = pSeanet->HeadRangescale/10;


		// To check and put in common code (change return with break, etc.)...?

		EnterCriticalSection(&SeanetConnectingCS);
		if ((AdLow != pSeanet->HeadADLow)||(AdSpan != pSeanet->HeadADSpan)||(Steps != pSeanet->HeadSteps)||(Hdctrl.u != pSeanet->HeadHdCtrl.u)||(NBins != pSeanet->HeadNBins)||
			(NSteps != pSeanet->NSteps)||(StepAngleSize != pSeanet->StepAngleSize)||(rangescale != pSeanet->RangeScale))
		{
			AdLow = pSeanet->HeadADLow; AdSpan = pSeanet->HeadADSpan; Steps = pSeanet->HeadSteps; Hdctrl.u = pSeanet->HeadHdCtrl.u; NBins = pSeanet->HeadNBins;
			NSteps = pSeanet->NSteps; StepAngleSize = pSeanet->StepAngleSize; rangescale = pSeanet->RangeScale;

			index_scanlines_prev = 0;
			index_scanlines = 0;

			free(tvs); free(angles); free(scanlines);
			tvs = NULL; angles = NULL; scanlines = NULL;
			tvs = (struct timeval*)calloc(NSteps, sizeof(struct timeval));
			angles = (double*)calloc(NSteps, sizeof(double));
			scanlines = (unsigned char*)calloc(NSteps*MAX_NB_BYTES_SEANET, sizeof(unsigned char));
			if ((tvs == NULL)||(angles == NULL)||(scanlines == NULL))
			{
				printf("Unable to allocate Seanet data.\n");
				LeaveCriticalSection(&SeanetConnectingCS);
				return EXIT_FAILURE;
			}
		}
		LeaveCriticalSection(&SeanetConnectingCS);


		//tv.tv_sec = Hour*3600+Min*60+(long)Seconds;
		//tv.tv_usec = (long)((Seconds-(long)Seconds)*1000000.0);
		*pAngle = ((Bearing-3200+6400)%6400)*0.05625; // Angle of the transducer in degrees (0.05625 = (1/16)*(9/10)).

		// We should take into account ADLow and ADSpan here?

		str = data;
		if (!Hdctrl.bits.adc8on)
		{
			for (i = 0; i < pSeanet->Dbytes; i++)
			{
				(void)sscanf(str, "%d", &byte);
				scanline[2*i+0] = (unsigned char)((byte>>4)*16);
				scanline[2*i+1] = (unsigned char)(((byte<<4)>>4)*16);
				str = strchr(str, ',');
				if (!str) break;
				str++;
			}
		}
		else
		{
			for (i = 0; i < pSeanet->Dbytes; i++)
			{
				(void)sscanf(str, "%d", &byte);
				scanline[i] = (unsigned char)byte;
				str = strchr(str, ',');
				if (!str) break;
				str++;
			}
		}

		return EXIT_SUCCESS;
	}
}